

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproto.c
# Opt level: O0

void * pool_alloc(pool *p,size_t sz)

{
  ulong sz_00;
  void *pvVar1;
  void *ret_1;
  void *ret;
  size_t sz_local;
  pool *p_local;
  
  sz_00 = sz + 7 & 0xfffffffffffffff8;
  if (sz_00 < 1000) {
    if (p->current == (chunk *)0x0) {
      pvVar1 = pool_newchunk(p,1000);
      if (pvVar1 == (void *)0x0) {
        return (void *)0x0;
      }
      p->current = p->header;
    }
    if (sz_00 + (long)p->current_used < 0x3e9) {
      p_local = (pool *)((long)&p->current[1].next + (long)p->current_used);
      p->current_used = p->current_used + (int)sz_00;
    }
    else if (sz_00 < (ulong)(long)p->current_used) {
      p_local = (pool *)pool_newchunk(p,1000);
      p->current = p->header;
      p->current_used = (int)sz_00;
    }
    else {
      p_local = (pool *)pool_newchunk(p,sz_00);
    }
  }
  else {
    p_local = (pool *)pool_newchunk(p,sz_00);
  }
  return p_local;
}

Assistant:

static void *
pool_alloc(struct pool *p, size_t sz) {
	// align by 8
	sz = (sz + 7) & ~7;
	if (sz >= CHUNK_SIZE) {
		return pool_newchunk(p, sz);
	}
	if (p->current == NULL) {
		if (pool_newchunk(p, CHUNK_SIZE) == NULL)
			return NULL;
		p->current = p->header;
	}
	if (sz + p->current_used <= CHUNK_SIZE) {
		void * ret = (char *)(p->current+1) + p->current_used;
		p->current_used += sz;
		return ret;
	}

	if (sz >= p->current_used) {
		return pool_newchunk(p, sz);
	} else {
		void * ret = pool_newchunk(p, CHUNK_SIZE);
		p->current = p->header;
		p->current_used = sz;
		return ret;
	}
}